

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O2

void __thiscall
asio::detail::
reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_asio::any_io_executor>
::reactive_socket_recv_op
          (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_asio::any_io_executor>
           *this,error_code *success_ec,socket_type socket,state_type state,
          mutable_buffers_1 *buffers,message_flags flags,
          io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>
          *handler,any_io_executor *io_ex)

{
  error_category *peVar1;
  size_t sVar2;
  undefined4 uVar3;
  
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  super_operation.next_ = (scheduler_operation *)0x0;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  super_operation.func_ = do_complete;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  super_operation.task_result_ = 0;
  uVar3 = *(undefined4 *)&success_ec->field_0x4;
  peVar1 = success_ec->_M_cat;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_value
       = success_ec->_M_value;
  *(undefined4 *)
   &(this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_.
    field_0x4 = uVar3;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_cat =
       peVar1;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  cancellation_key_ = (void *)0x0;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  bytes_transferred_ = 0;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.perform_func_
       = reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).socket_ = socket;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).state_ = state;
  sVar2 = (buffers->super_mutable_buffer).size_;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.super_mutable_buffer.
  data_ = (buffers->super_mutable_buffer).data_;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.super_mutable_buffer.
  size_ = sVar2;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).flags_ = flags;
  asio::ssl::detail::
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>
  ::io_op(&this->handler_,handler);
  handler_work<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_asio::any_io_executor,_void>
  ::handler_work(&this->work_,&this->handler_,io_ex);
  return;
}

Assistant:

reactive_socket_recv_op(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state,
      const MutableBufferSequence& buffers, socket_base::message_flags flags,
      Handler& handler, const IoExecutor& io_ex)
    : reactive_socket_recv_op_base<MutableBufferSequence>(success_ec, socket,
        state, buffers, flags, &reactive_socket_recv_op::do_complete),
      handler_(ASIO_MOVE_CAST(Handler)(handler)),
      work_(handler_, io_ex)
  {
  }